

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

int Vec_PtrPushUnique(Vec_Ptr_t *p,void *Entry)

{
  int local_24;
  int i;
  void *Entry_local;
  Vec_Ptr_t *p_local;
  
  local_24 = 0;
  while( true ) {
    if (p->nSize <= local_24) {
      Vec_PtrPush(p,Entry);
      return 0;
    }
    if (p->pArray[local_24] == Entry) break;
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

static inline int Vec_PtrPushUnique( Vec_Ptr_t * p, void * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_PtrPush( p, Entry );
    return 0;
}